

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

UnicodeString *
anon_unknown.dwarf_12e3cb::getWithPlural
          (UnicodeString *__return_storage_ptr__,UnicodeString *strings,Form plural,
          UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  Form plural_local;
  UnicodeString *strings_local;
  UnicodeString *result;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,strings + plural);
  UVar1 = icu_63::UnicodeString::isBogus(__return_storage_ptr__);
  if (UVar1 != '\0') {
    icu_63::UnicodeString::operator=(__return_storage_ptr__,strings + 5);
  }
  UVar1 = icu_63::UnicodeString::isBogus(__return_storage_ptr__);
  if (UVar1 != '\0') {
    *status = U_INTERNAL_PROGRAM_ERROR;
  }
  return __return_storage_ptr__;
}

Assistant:

static UnicodeString getWithPlural(
        const UnicodeString* strings,
        StandardPlural::Form plural,
        UErrorCode& status) {
    UnicodeString result = strings[plural];
    if (result.isBogus()) {
        result = strings[StandardPlural::Form::OTHER];
    }
    if (result.isBogus()) {
        // There should always be data in the "other" plural variant.
        status = U_INTERNAL_PROGRAM_ERROR;
    }
    return result;
}